

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::range_query(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              *this,pair<unsigned_long_long,_int> *keyl,pair<unsigned_long_long,_int> *keyr)

{
  unsigned_long_long *puVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  ulong *in_RCX;
  long lVar7;
  ulong extraout_RDX;
  ulong uVar8;
  ulong extraout_RDX_00;
  int iVar9;
  ulong unaff_RBP;
  int *piVar10;
  long unaff_R12;
  undefined1 auVar11 [16];
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> vVar12;
  locType pos;
  ulong local_58;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *local_50;
  pair<const_std::pair<unsigned_long_long,_int>,_long> local_48;
  
  *(undefined4 *)((long)&this->root + 4) = 10;
  pvVar4 = operator_new(0xf0);
  *(void **)this = pvVar4;
  *(undefined4 *)&this->root = 0;
  iVar9 = (int)keyl->first;
  uVar8 = extraout_RDX;
  if (iVar9 == 0) {
LAB_00112d0d:
    vVar12.currentLength = (int)uVar8;
    vVar12.maxSize = (int)(uVar8 >> 0x20);
    vVar12.data = (pair<const_std::pair<unsigned_long_long,_int>,_long> *)this;
    return vVar12;
  }
  local_58 = *(ulong *)&keyl->second;
  local_50 = this;
  if (0 < iVar9) {
    iVar9 = 0;
    do {
      auVar11 = (**(code **)(*(long *)keyl[1].first + 0x10))((long *)keyl[1].first,&local_58);
      uVar8 = auVar11._8_8_;
      unaff_R12 = auVar11._0_8_;
      unaff_RBP = (ulong)*(int *)(unaff_R12 + 0x958);
      if ((long)unaff_RBP < 1) {
        unaff_RBP = 0;
      }
      else {
        uVar3 = keyr->first;
        uVar2 = keyr->second;
        uVar8 = (ulong)uVar2;
        piVar10 = (int *)(unaff_R12 + 0x330);
        uVar5 = 0;
        do {
          if ((uVar3 <= *(ulong *)(piVar10 + -2)) &&
             ((uVar3 < *(ulong *)(piVar10 + -2) || ((int)uVar2 <= *piVar10)))) {
            iVar6 = (int)keyl->first;
            if (iVar9 < iVar6 + -1) {
              if ((uVar3 < *(ulong *)(piVar10 + -2)) ||
                 ((uVar3 <= *(ulong *)(piVar10 + -2) && ((int)uVar2 < *piVar10)))) {
                unaff_RBP = uVar5 & 0xffffffff;
                goto LAB_00112c61;
              }
              uVar8 = *(ulong *)(unaff_R12 + 8 + uVar5 * 8);
              local_58 = uVar8;
            }
            unaff_RBP = uVar5 & 0xffffffff;
            goto LAB_00112c7c;
          }
          uVar5 = uVar5 + 1;
          piVar10 = piVar10 + 4;
        } while (unaff_RBP != uVar5);
      }
      iVar6 = (int)keyl->first;
      if (iVar9 < iVar6 + -1) {
        uVar5 = unaff_RBP & 0xffffffff;
LAB_00112c61:
        local_58 = *(ulong *)(unaff_R12 + uVar5 * 8);
      }
LAB_00112c7c:
      iVar9 = iVar9 + 1;
    } while (iVar9 < iVar6);
  }
  this = local_50;
  do {
    iVar9 = (int)unaff_RBP;
    if (iVar9 == *(int *)(unaff_R12 + 0x958)) {
      if (*(long *)(unaff_R12 + 800) == -1) goto LAB_00112d0d;
      unaff_R12 = (**(code **)(*(long *)keyl[1].first + 0x10))
                            ((long *)keyl[1].first,unaff_R12 + 800);
      iVar9 = 0;
    }
    lVar7 = (long)iVar9 * 0x10;
    uVar8 = *in_RCX;
    uVar3 = *(ulong *)(unaff_R12 + 0x328 + lVar7);
    if ((uVar8 < uVar3) ||
       ((puVar1 = (unsigned_long_long *)(unaff_R12 + 0x328 + lVar7), uVar8 <= uVar3 &&
        (uVar8 = (ulong)(uint)in_RCX[1], (int)(uint)in_RCX[1] < (int)puVar1[1]))))
    goto LAB_00112d0d;
    local_48.second = *(long *)(unaff_R12 + (long)iVar9 * 8);
    local_48.first.first = *puVar1;
    local_48.first._8_8_ = puVar1[1];
    vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::push_back
              ((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)this,&local_48)
    ;
    unaff_RBP = (ulong)(iVar9 + 1);
    uVar8 = extraout_RDX_00;
  } while( true );
}

Assistant:

vector<value_type> range_query(const Key &keyl, const Key &keyr) {
            vector<value_type> ret;
            if (!depth)return ret;
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], keyl); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(keyl, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            while (1) {
                if (j == x->sz) {
                    if (x->nxt == -1)break;
                    x = file->read(x->nxt);
                    j = 0;
                }
                if (Compare()(keyr, x->keyvalue[j]))break;
                ret.push_back(std::make_pair(x->keyvalue[j], x->val[j]));
                ++j;
            }
            return ret;
        }